

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O3

bool __thiscall cinatra::uri_t::is_websocket(uri_t *this)

{
  size_t sVar1;
  short *psVar2;
  bool bVar3;
  
  sVar1 = (this->schema)._M_len;
  psVar2 = (short *)(this->schema)._M_str;
  if (sVar1 == 3) {
    bVar3 = (char)psVar2[1] == 's' && *psVar2 == 0x7377;
  }
  else {
    if (sVar1 != 2) {
      return false;
    }
    bVar3 = *psVar2 == 0x7377;
  }
  return bVar3;
}

Assistant:

bool is_websocket() { return schema == "ws"sv || schema == "wss"sv; }